

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int32_t zng_deflateSetParams(zng_stream *strm,zng_deflate_param_value *params,size_t count)

{
  zng_deflate_param zVar1;
  internal_state *piVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  int32_t iVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  int32_t *piVar10;
  zng_deflate_param_value *pzVar11;
  zng_deflate_param_value *pzVar12;
  zng_deflate_param_value *pzVar13;
  zng_deflate_param_value *pzVar14;
  zng_deflate_param_value *pzVar15;
  zng_deflate_param_value *pzVar16;
  int32_t iVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  long lVar22;
  
  auVar3 = _DAT_00179430;
  if (count != 0) {
    uVar7 = count + 3 & 0xfffffffffffffffc;
    lVar22 = count - 1;
    auVar20._8_4_ = (int)lVar22;
    auVar20._0_8_ = lVar22;
    auVar20._12_4_ = (int)((ulong)lVar22 >> 0x20);
    piVar10 = &params[3].status;
    auVar20 = auVar20 ^ _DAT_00179430;
    auVar21 = _DAT_00179410;
    auVar23 = _DAT_00179420;
    do {
      auVar24 = auVar23 ^ auVar3;
      iVar5 = auVar20._4_4_;
      if ((bool)(~(auVar24._4_4_ == iVar5 && auVar20._0_4_ < auVar24._0_4_ || iVar5 < auVar24._4_4_)
                & 1)) {
        piVar10[-0x18] = 0;
      }
      if ((auVar24._12_4_ != auVar20._12_4_ || auVar24._8_4_ <= auVar20._8_4_) &&
          auVar24._12_4_ <= auVar20._12_4_) {
        piVar10[-0x10] = 0;
      }
      auVar24 = auVar21 ^ auVar3;
      iVar25 = auVar24._4_4_;
      if (iVar25 <= iVar5 && (iVar25 != iVar5 || auVar24._0_4_ <= auVar20._0_4_)) {
        piVar10[-8] = 0;
        *piVar10 = 0;
      }
      lVar22 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar22 + 4;
      lVar22 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar22 + 4;
      piVar10 = piVar10 + 0x20;
      uVar7 = uVar7 - 4;
    } while (uVar7 != 0);
  }
  iVar5 = deflateStateCheck(strm);
  iVar6 = -2;
  if (iVar5 == 0) {
    piVar2 = strm->state;
    if (count == 0) {
      bVar19 = true;
      pzVar14 = (zng_deflate_param_value *)0x0;
      pzVar12 = (zng_deflate_param_value *)0x0;
      pzVar16 = (zng_deflate_param_value *)0x0;
      iVar17 = 0;
    }
    else {
      bVar19 = false;
      bVar4 = false;
      pzVar11 = (zng_deflate_param_value *)0x0;
      pzVar13 = (zng_deflate_param_value *)0x0;
      pzVar15 = (zng_deflate_param_value *)0x0;
      do {
        zVar1 = params->param;
        pzVar12 = pzVar11;
        pzVar16 = pzVar15;
        if (zVar1 == Z_DEFLATE_LEVEL) {
          bVar18 = params->size < 4;
          pzVar14 = params;
          if (pzVar13 != (zng_deflate_param_value *)0x0) {
            bVar18 = true;
            iVar6 = -5;
            pzVar11 = pzVar13;
            pzVar13 = params;
            goto LAB_00132343;
          }
        }
        else {
          pzVar14 = pzVar13;
          if (zVar1 == Z_DEFLATE_STRATEGY) {
            bVar18 = params->size < 4;
            pzVar12 = params;
            if (pzVar11 == (zng_deflate_param_value *)0x0) goto LAB_00132346;
            bVar18 = true;
            iVar6 = -5;
          }
          else if (zVar1 == Z_DEFLATE_REPRODUCIBLE) {
            bVar18 = params->size < 4;
            pzVar16 = params;
            if (pzVar15 == (zng_deflate_param_value *)0x0) goto LAB_00132346;
            bVar18 = true;
            iVar6 = -5;
            pzVar11 = pzVar15;
            pzVar15 = params;
          }
          else {
            bVar4 = true;
            iVar6 = -6;
            bVar18 = false;
            pzVar11 = params;
          }
LAB_00132343:
          pzVar11->status = iVar6;
          pzVar14 = pzVar13;
          pzVar16 = pzVar15;
        }
LAB_00132346:
        if (bVar18) {
          params->status = -5;
          bVar19 = true;
        }
        params = params + 1;
        count = count - 1;
        pzVar11 = pzVar12;
        pzVar13 = pzVar14;
        pzVar15 = pzVar16;
      } while (count != 0);
      bVar19 = !bVar19;
      iVar17 = -6;
      if (!bVar4) {
        iVar17 = 0;
      }
    }
    iVar6 = -5;
    if (bVar19) {
      bVar19 = true;
      if (pzVar14 != (zng_deflate_param_value *)0x0 || pzVar12 != (zng_deflate_param_value *)0x0) {
        if (pzVar14 == (zng_deflate_param_value *)0x0) {
          piVar8 = &piVar2->level;
        }
        else {
          piVar8 = (int *)pzVar14->buf;
        }
        if (pzVar12 == (zng_deflate_param_value *)0x0) {
          piVar9 = &piVar2->strategy;
        }
        else {
          piVar9 = (int *)pzVar12->buf;
        }
        iVar6 = zng_deflateParams(strm,*piVar8,*piVar9);
        bVar19 = iVar6 == 0;
        if (!bVar19) {
          if (pzVar14 != (zng_deflate_param_value *)0x0) {
            pzVar14->status = -2;
          }
          if (pzVar12 != (zng_deflate_param_value *)0x0) {
            pzVar12->status = -2;
          }
          bVar19 = false;
        }
      }
      if (pzVar16 != (zng_deflate_param_value *)0x0) {
        piVar2->reproducible = *pzVar16->buf;
      }
      iVar6 = -2;
      if (bVar19) {
        iVar6 = iVar17;
      }
    }
  }
  return iVar6;
}

Assistant:

int32_t Z_EXPORT zng_deflateSetParams(zng_stream *strm, zng_deflate_param_value *params, size_t count) {
    size_t i;
    deflate_state *s;
    zng_deflate_param_value *new_level = NULL;
    zng_deflate_param_value *new_strategy = NULL;
    zng_deflate_param_value *new_reproducible = NULL;
    int param_buf_error;
    int version_error = 0;
    int buf_error = 0;
    int stream_error = 0;

    /* Initialize the statuses. */
    for (i = 0; i < count; i++)
        params[i].status = Z_OK;

    /* Check whether the stream state is consistent. */
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    /* Check buffer sizes and detect duplicates. */
    for (i = 0; i < count; i++) {
        switch (params[i].param) {
            case Z_DEFLATE_LEVEL:
                param_buf_error = deflateSetParamPre(&new_level, sizeof(int), &params[i]);
                break;
            case Z_DEFLATE_STRATEGY:
                param_buf_error = deflateSetParamPre(&new_strategy, sizeof(int), &params[i]);
                break;
            case Z_DEFLATE_REPRODUCIBLE:
                param_buf_error = deflateSetParamPre(&new_reproducible, sizeof(int), &params[i]);
                break;
            default:
                params[i].status = Z_VERSION_ERROR;
                version_error = 1;
                param_buf_error = 0;
                break;
        }
        if (param_buf_error) {
            params[i].status = Z_BUF_ERROR;
            buf_error = 1;
        }
    }
    /* Exit early if small buffers or duplicates are detected. */
    if (buf_error)
        return Z_BUF_ERROR;

    /* Apply changes, remember if there were errors. */
    if (new_level != NULL || new_strategy != NULL) {
        int ret = PREFIX(deflateParams)(strm, new_level == NULL ? s->level : *(int *)new_level->buf,
                                        new_strategy == NULL ? s->strategy : *(int *)new_strategy->buf);
        if (ret != Z_OK) {
            if (new_level != NULL)
                new_level->status = Z_STREAM_ERROR;
            if (new_strategy != NULL)
                new_strategy->status = Z_STREAM_ERROR;
            stream_error = 1;
        }
    }
    if (new_reproducible != NULL) {
        int val = *(int *)new_reproducible->buf;
        if (DEFLATE_CAN_SET_REPRODUCIBLE(strm, val)) {
            s->reproducible = val;
        } else {
            new_reproducible->status = Z_STREAM_ERROR;
            stream_error = 1;
        }
    }

    /* Report version errors only if there are no real errors. */
    return stream_error ? Z_STREAM_ERROR : (version_error ? Z_VERSION_ERROR : Z_OK);
}